

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O2

int countSpilled(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *tempToColorMap)

{
  _Base_ptr p_Var1;
  int iVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  entry;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  pStack_48;
  
  iVar2 = 0;
  for (p_Var1 = (tempToColorMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(tempToColorMap->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair(&pStack_48,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)(p_Var1 + 1));
    iVar2 = iVar2 + (uint)(pStack_48.second == IN_MEMORY_COLOR);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  return iVar2;
}

Assistant:

int countSpilled(std::map<std::string, int>& tempToColorMap) {
    int count = 0;
    for (auto entry : tempToColorMap) {
        if (entry.second == IN_MEMORY_COLOR) {
            ++count;
        }
    }

    return count;
}